

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

void __thiscall helics::Input::setMinimumChange(Input *this,double deltaV)

{
  double deltaV_local;
  Input *this_local;
  
  if (this->delta <= 0.0 && this->delta != 0.0) {
    this->changeDetectionEnabled = true;
  }
  this->delta = deltaV;
  if (this->delta <= 0.0 && this->delta != 0.0) {
    this->changeDetectionEnabled = false;
  }
  return;
}

Assistant:

void setMinimumChange(double deltaV) noexcept
    {
        // this first check enables change detection if it was disabled via negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = true;
        }
        delta = deltaV;
        // the second checks if we should disable from negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = false;
        }
    }